

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

float ncnn::reduction(float v0,float *ptr,int size0,int size1,int stride1,int op_type)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float sum;
  
  if ((uint)op_type < 0xb) {
    uVar1 = (ulong)(uint)size0;
    switch(op_type) {
    case 0:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              v0 = v0 + ptr[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 1:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              v0 = v0 + ABS(ptr[uVar3]);
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 2:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              v0 = v0 + ptr[uVar3] * ptr[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 4:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              if (v0 <= ptr[uVar3]) {
                v0 = ptr[uVar3];
              }
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 5:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              if (ptr[uVar3] <= v0) {
                v0 = ptr[uVar3];
              }
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 6:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              v0 = v0 * ptr[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
      break;
    case 10:
      if (0 < size1) {
        iVar2 = 0;
        do {
          if (0 < size0) {
            uVar3 = 0;
            do {
              fVar4 = expf(ptr[uVar3]);
              v0 = v0 + fVar4;
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          iVar2 = iVar2 + 1;
          ptr = ptr + stride1;
        } while (iVar2 != size1);
      }
    }
  }
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size0, size1, stride1);

    // should never reach here
    return v0;
}